

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O2

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isLLRule
          (CycleBreaking<covenant::Sym> *this,CFG *g,uint lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  Sym *pSVar1;
  const_iterator End;
  bool bVar2;
  bool bVar3;
  
  pSVar1 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_start;
  End._M_current =
       (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  bVar3 = true;
  if (pSVar1 != End._M_current) {
    bVar2 = allTerminal(this,pSVar1 + 1,End,scc);
    if (bVar2) {
      pSVar1 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pSVar1->x != lhs * 2 + 1) {
        bVar3 = isTerminal(this,pSVar1,scc);
        return bVar3;
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool isLLRule (const CFG &g, unsigned int lhs, const vector<EdgeSym> &rhs, 
                 const set<int> &scc)
  {
    if (rhs.empty()) 
      return true;
    if (allTerminal(rhs.begin()+1, rhs.end(), scc))
      return ((rhs[0] == EdgeSym::mkVar(lhs)) || isTerminal(rhs[0],scc));
    else
      return false;
  }